

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# literal.cpp
# Opt level: O0

Literal * __thiscall wasm::Literal::bitmaskI64x2(Literal *__return_storage_ptr__,Literal *this)

{
  reference this_00;
  ulong uVar1;
  ulong local_58;
  size_t i;
  LaneArray<2> lanes;
  uint32_t result;
  Literal *this_local;
  
  lanes._M_elems[1].type.id._4_4_ = 0;
  getLanesI64x2((LaneArray<2> *)&i,this);
  for (local_58 = 0; local_58 < 2; local_58 = local_58 + 1) {
    this_00 = std::array<wasm::Literal,_2UL>::operator[]((array<wasm::Literal,_2UL> *)&i,local_58);
    uVar1 = geti64(this_00);
    if ((uVar1 & 0x8000000000000000) != 0) {
      lanes._M_elems[1].type.id._4_4_ =
           lanes._M_elems[1].type.id._4_4_ | 1 << ((byte)local_58 & 0x1f);
    }
  }
  Literal(__return_storage_ptr__,lanes._M_elems[1].type.id._4_4_);
  std::array<wasm::Literal,_2UL>::~array((array<wasm::Literal,_2UL> *)&i);
  return __return_storage_ptr__;
}

Assistant:

Literal Literal::bitmaskI64x2() const {
  uint32_t result = 0;
  LaneArray<2> lanes = getLanesI64x2();
  for (size_t i = 0; i < 2; ++i) {
    if (lanes[i].geti64() & (1ll << 63)) {
      result = result | (1 << i);
    }
  }
  return Literal(result);
}